

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdemon.cpp
# Opt level: O0

void my_slot_demon(Am_Object param_1)

{
  uint uVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *pvVar4;
  int top;
  Am_Object_Advanced self;
  Am_Slot slot_local;
  
  self.super_Am_Object.data = (Am_Object)(Am_Object)param_1.data;
  Am_Slot::Get_Owner();
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe8,0x65);
  uVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set((ushort)&stack0xffffffffffffffe8,(uint)MY_SLOT,(ulong)uVar1);
  poVar3 = std::operator<<((ostream *)&std::cerr,"demon activated at ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar1);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Network contains ");
  pAVar2 = Am_Object::Peek(&Foo,MY_SLOT,0);
  pvVar4 = (void *)operator<<(poVar3,pAVar2);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void
my_slot_demon(Am_Slot slot)

{

  Am_Object_Advanced self = slot.Get_Owner();
  int top;
  top = self.Get(Am_TOP);
  self.Set(MY_SLOT, top);

  cerr << "demon activated at " << top << endl << flush;
  cerr << "Network contains " << Foo.Peek(MY_SLOT) << endl << flush;
}